

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btCollisionWorld::contactTest
          (btCollisionWorld *this,btCollisionObject *colObj,ContactResultCallback *resultCallback)

{
  btVector3 aabbMax;
  btVector3 aabbMin;
  btSingleContactCallback contactCB;
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined **local_48;
  btCollisionObject *local_40;
  btCollisionWorld *local_38;
  ContactResultCallback *local_30;
  
  (*colObj->m_collisionShape->_vptr_btCollisionShape[2])
            (colObj->m_collisionShape,&colObj->m_worldTransform,local_58,auStack_68);
  local_48 = &PTR__btBroadphaseAabbCallback_00223c60;
  local_40 = colObj;
  local_38 = this;
  local_30 = resultCallback;
  (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[7])
            (this->m_broadphasePairCache,local_58,auStack_68);
  return;
}

Assistant:

void	btCollisionWorld::contactTest( btCollisionObject* colObj, ContactResultCallback& resultCallback)
{
	btVector3 aabbMin,aabbMax;
	colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(),aabbMin,aabbMax);
	btSingleContactCallback	contactCB(colObj,this,resultCallback);
	
	m_broadphasePairCache->aabbTest(aabbMin,aabbMax,contactCB);
}